

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

bool __thiscall ON_wString::StartsWithNoCase(ON_wString *this,wchar_t *wszSub)

{
  wchar_t *pwVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  ON_Internal_Empty_wString *pOVar5;
  int i;
  size_t sVar6;
  bool bVar7;
  
  sVar4 = wcslen(wszSub);
  if (sVar4 != 0) {
    pwVar1 = this->m_s;
    pOVar5 = &empty_wstring;
    if (pwVar1 != (wchar_t *)0x0) {
      pOVar5 = (ON_Internal_Empty_wString *)(pwVar1 + -3);
    }
    if (sVar4 <= (ulong)(long)(pOVar5->header).string_length) {
      sVar6 = 0;
      do {
        bVar7 = sVar4 == sVar6;
        if (bVar7) {
          return bVar7;
        }
        iVar2 = tolower(pwVar1[sVar6]);
        iVar3 = tolower(wszSub[sVar6]);
        sVar6 = sVar6 + 1;
      } while (iVar2 == iVar3);
      return bVar7;
    }
  }
  return false;
}

Assistant:

bool ON_wString::StartsWithNoCase(const wchar_t* wszSub) const
{
  const auto lenSub = wcslen(wszSub);
  if (0 == lenSub)
    return false;

  if (lenSub > Header()->string_length)
    return false;

  for (int i = 0; i < lenSub; i++)
  {
    if (tolower(m_s[i]) != tolower(wszSub[i]))
      return false;
  }

  return true;
}